

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

err_t rngTimerRead(void *buf,size_t *read,size_t count)

{
  bool_t bVar1;
  tm_ticks_t tVar2;
  ulong in_RDX;
  ulong *in_RSI;
  long in_RDI;
  size_t reps;
  size_t j;
  size_t i;
  word w;
  tm_ticks_t t;
  tm_ticks_t ticks;
  ulong uVar3;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_28;
  undefined4 local_4;
  
  bVar1 = rngTimerIsAvail();
  if (bVar1 == 0) {
    local_4 = 0xca;
  }
  else {
    for (local_40 = 0; local_40 < in_RDX; local_40 = local_40 + 1) {
      *(undefined1 *)(in_RDI + local_40) = 0;
      local_28 = tmTicks();
      for (local_48 = 0; local_48 < 8; local_48 = local_48 + 1) {
        local_38 = 0;
        for (uVar3 = 0; uVar3 < 8; uVar3 = uVar3 + 1) {
          mtSleep((u32)(uVar3 >> 0x20));
          tVar2 = tmTicks();
          local_38 = tVar2 - local_28 ^ local_38;
          local_28 = tVar2;
        }
        bVar1 = u64Parity(local_38);
        *(byte *)(in_RDI + local_40) =
             *(byte *)(in_RDI + local_40) ^ (byte)(bVar1 << ((byte)local_48 & 0x1f));
      }
    }
    *in_RSI = in_RDX;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static err_t rngTimerRead(void* buf, size_t* read, size_t count)
{
	register tm_ticks_t ticks;
	register tm_ticks_t t;
	register word w;
	size_t i, j, reps;
	// pre
	ASSERT(memIsValid(read, sizeof(size_t)));
	ASSERT(memIsValid(buf, count));
	// есть источник?
	if (!rngTimerIsAvail())
		return ERR_FILE_NOT_FOUND;
	// генерация
	for (i = 0; i < count; ++i)
	{
		((octet*)buf)[i] = 0;
		ticks = tmTicks();
		for (j = 0; j < 8; ++j)
		{
			w = 0;
			for (reps = 0; reps < 8; ++reps)
			{
				mtSleep(0);
				t = tmTicks();
				w ^= (word)(t - ticks);
				ticks = t;
			}
			((octet*)buf)[i] ^= wordParity(w) << j;
		}
	}
	ticks = t = 0, w = 0;
	*read = count;
	return ERR_OK;
}